

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O0

int decoder_get_uint32_value(ndn_decoder_t *decoder,uint32_t *value)

{
  int local_24;
  int i;
  uint32_t *value_local;
  ndn_decoder_t *decoder_local;
  
  if (decoder->input_size < decoder->offset + 4) {
    decoder_local._4_4_ = -10;
  }
  else {
    *value = 0;
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      *value = ((uint)decoder->input_value[decoder->offset + local_24] <<
               (('\x03' - (char)local_24) * '\b' & 0x1fU)) + *value;
    }
    decoder->offset = decoder->offset + 4;
    decoder_local._4_4_ = 0;
  }
  return decoder_local._4_4_;
}

Assistant:

static inline int
decoder_get_uint32_value(ndn_decoder_t* decoder, uint32_t* value)
{
  if (decoder->offset + 4 > decoder->input_size)
    return NDN_OVERSIZE;
  *value = 0;
  for (int i = 0; i < 4; i++) {
    *value += (uint32_t)decoder->input_value[decoder->offset + i] << (8 * (3 - i));
  }
  decoder->offset += 4;
  return 0;
}